

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_object.cpp
# Opt level: O0

void mjs::anon_unknown_33::define_accessor_property
               (gc_heap_ptr<mjs::global_object> *global,object_ptr *o,string *name,value *get,
               value *set,property_attribute attr)

{
  value *name_00;
  bool bVar1;
  object *this;
  byte local_55;
  gc_heap_ptr<mjs::object> local_48;
  property_attribute local_34;
  value *pvStack_30;
  property_attribute attr_local;
  value *set_local;
  value *get_local;
  string *name_local;
  object_ptr *o_local;
  gc_heap_ptr<mjs::global_object> *global_local;
  
  local_34 = attr;
  pvStack_30 = set;
  set_local = get;
  get_local = (value *)name;
  name_local = (string *)o;
  o_local = (object_ptr *)global;
  bVar1 = is_valid(attr);
  local_55 = 0;
  if (bVar1) {
    bVar1 = has_attributes(local_34,accessor);
    local_55 = bVar1 ^ 0xff;
  }
  if ((local_55 & 1) != 0) {
    this = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)name_local);
    name_00 = get_local;
    make_accessor_object
              ((mjs *)&local_48,(gc_heap_ptr<mjs::global_object> *)o_local,set_local,pvStack_30);
    object::define_accessor_property(this,(string *)name_00,(object_ptr *)&local_48,local_34);
    gc_heap_ptr<mjs::object>::~gc_heap_ptr(&local_48);
    return;
  }
  __assert_fail("is_valid(attr) && !has_attributes(attr, property_attribute::accessor)",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object_object.cpp"
                ,0x44,
                "void mjs::(anonymous namespace)::define_accessor_property(const gc_heap_ptr<global_object> &, const object_ptr &, const string &, const value &, const value &, property_attribute)"
               );
}

Assistant:

void define_accessor_property(const gc_heap_ptr<global_object>& global, const object_ptr& o, const string& name, const value& get, const value& set, property_attribute attr) {
    assert(is_valid(attr) && !has_attributes(attr, property_attribute::accessor));
    o->define_accessor_property(name, make_accessor_object(global, get, set), attr);
}